

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string *value)

{
  bool bVar1;
  undefined8 in_RAX;
  uint32 length;
  uint32 local_14;
  
  local_14 = (uint32)((ulong)in_RAX >> 0x20);
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_14);
  if (bVar1) {
    bVar1 = io::CodedInputStream::ReadString(input,value,local_14);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input,
                               std::string* value) {
  return ReadBytesToString(input, value);
}